

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

void hide_resize_helper(natwm_state *state)

{
  xcb_window_t xVar1;
  xcb_configure_window_value_list_t values;
  
  xVar1 = state->button_state->resize_helper;
  if (xVar1 != 0) {
    xcb_configure_window_aux(state->xcb,xVar1,0x5f);
    xcb_flush(state->xcb);
  }
  return;
}

Assistant:

static void hide_resize_helper(const struct natwm_state *state)
{
        if (state->button_state->resize_helper == XCB_NONE) {
                return;
        }

        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y | XCB_CONFIG_WINDOW_WIDTH
                | XCB_CONFIG_WINDOW_HEIGHT | XCB_CONFIG_WINDOW_BORDER_WIDTH
                | XCB_CONFIG_WINDOW_STACK_MODE;
        xcb_configure_window_value_list_t values = {
                .x = -1,
                .y = -1,
                .width = 1,
                .height = 1,
                .border_width = 0,
                .stack_mode = XCB_STACK_MODE_BELOW,
        };

        xcb_configure_window_aux(state->xcb, state->button_state->resize_helper, mask, &values);

        xcb_flush(state->xcb);
}